

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall Catch::clara::detail::ExeName::set(ExeName *this,string *newName)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  string *in_RDX;
  long in_RSI;
  ParserResult *in_RDI;
  string filename;
  size_type lastSlash;
  ParseResultType *in_stack_ffffffffffffff88;
  ParserResult *this_01;
  string local_40 [32];
  long local_20;
  string *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_20 = ::std::__cxx11::string::find_last_of((char *)in_RDX,0x2057fd);
  if (local_20 == -1) {
    ::std::__cxx11::string::string(local_40,local_18);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)local_18);
  }
  this_00 = std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  ::std::__cxx11::string::operator=((string *)this_00,local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x18));
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16202e);
    (*(peVar2->super_BoundRef)._vptr_BoundRef[4])(this_01,peVar2,local_40);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              (in_stack_ffffffffffffff88);
  }
  ::std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

auto set( std::string const& newName ) -> ParserResult {

            auto lastSlash = newName.find_last_of( "\\/" );
            auto filename = ( lastSlash == std::string::npos )
                    ? newName
                    : newName.substr( lastSlash+1 );

            *m_name = filename;
            if( m_ref )
                return m_ref->setValue( filename );
            else
                return ParserResult::ok( ParseResultType::Matched );
        }